

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Display.cpp
# Opt level: O3

void __thiscall MT32Emu::Display::programChanged(Display *this,Bit8u partIndex)

{
  bool bVar1;
  Part *part;
  char *pcVar2;
  
  bVar1 = Synth::isDisplayOldMT32Compatible(this->synth);
  if ((bVar1) || (1 < this->mode - Mode_CUSTOM_MESSAGE)) {
    this->mode = Mode_PROGRAM_CHANGE;
    this->lcdDirty = true;
    this->displayResetTimestamp = this->synth->renderedSampleCount + 0xa3d7;
    this->displayResetScheduled = true;
    this->lastProgramChangePartIndex = partIndex;
    part = Synth::getPart(this->synth,partIndex);
    pcVar2 = Synth::getSoundGroupName(this->synth,part);
    this->lastProgramChangeSoundGroupName = pcVar2;
    pcVar2 = Part::getCurrentInstr(part);
    *(undefined8 *)this->lastProgramChangeTimbreName = *(undefined8 *)pcVar2;
    *(undefined2 *)(this->lastProgramChangeTimbreName + 8) = *(undefined2 *)(pcVar2 + 8);
  }
  return;
}

Assistant:

void Display::programChanged(Bit8u partIndex) {
	if (!synth.isDisplayOldMT32Compatible() && (mode == Mode_CUSTOM_MESSAGE || mode == Mode_ERROR_MESSAGE)) return;
	mode = Mode_PROGRAM_CHANGE;
	lcdDirty = true;
	scheduleDisplayReset();
	lastProgramChangePartIndex = partIndex;
	const Part *part = synth.getPart(partIndex);
	lastProgramChangeSoundGroupName = synth.getSoundGroupName(part);
	memcpy(lastProgramChangeTimbreName, part->getCurrentInstr(), TIMBRE_NAME_SIZE);
}